

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell.cpp
# Opt level: O0

MetadataResult DumpTable(ShellState *state,char **azArg,idx_t nArg)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  ShellState *in_RDX;
  ShellState *in_RSI;
  ShellState *in_RDI;
  char *z;
  idx_t i;
  int savedShellFlags;
  bool savedShowHeader;
  char *zSql;
  char *zLike;
  char *local_48;
  ShellState *local_40;
  char *pcVar4;
  
  pcVar4 = (char *)0x0;
  bVar1 = in_RDI->showHeader;
  uVar2 = in_RDI->shellFlgs;
  duckdb_shell::ShellState::ShellClearFlag(in_RDI,0x58);
  local_40 = (ShellState *)0x1;
  do {
    if (in_RDX <= local_40) {
      duckdb_shell::ShellState::OpenDB(in_RDX,(int)((ulong)pcVar4 >> 0x20));
      fprintf((FILE *)in_RDI->out,"BEGIN TRANSACTION;\n");
      in_RDI->showHeader = false;
      in_RDI->nErr = 0;
      if (pcVar4 == (char *)0x0) {
        pcVar4 = duckdb_shell_sqlite3_mprintf("true");
      }
      duckdb_shell_sqlite3_mprintf
                ("SELECT name, type, sql FROM sqlite_schema WHERE (%s) AND type==\'table\'  AND sql NOT NULL ORDER BY tbl_name=\'sqlite_sequence\'"
                 ,pcVar4);
      duckdb_shell::ShellState::RunSchemaDumpQuery(in_RSI,(char *)in_RDX);
      duckdb_shell_sqlite3_free((void *)0x1dd3e4);
      duckdb_shell_sqlite3_mprintf
                ("SELECT sql FROM sqlite_schema WHERE (%s) AND sql NOT NULL  AND type IN (\'index\',\'trigger\',\'view\')"
                 ,pcVar4);
      duckdb_shell::ShellState::RunTableDumpQuery((ShellState *)i,z);
      duckdb_shell_sqlite3_free((void *)0x1dd415);
      duckdb_shell_sqlite3_free((void *)0x1dd41f);
      pcVar4 = "COMMIT;\n";
      if (in_RDI->nErr != 0) {
        pcVar4 = "ROLLBACK; -- due to errors\n";
      }
      fprintf((FILE *)in_RDI->out,pcVar4);
      in_RDI->showHeader = (bool)(bVar1 & 1);
      in_RDI->shellFlgs = uVar2;
      return SUCCESS;
    }
    if (*(char *)&((&in_RSI->db)[(long)local_40]->db).
                  super_unique_ptr<duckdb::DuckDB,_std::default_delete<duckdb::DuckDB>_>._M_t.
                  super___uniq_ptr_impl<duckdb::DuckDB,_std::default_delete<duckdb::DuckDB>_>._M_t.
                  super__Tuple_impl<0UL,_duckdb::DuckDB_*,_std::default_delete<duckdb::DuckDB>_> ==
        '-') {
      local_48 = (char *)((long)&((&in_RSI->db)[(long)local_40]->db).
                                 super_unique_ptr<duckdb::DuckDB,_std::default_delete<duckdb::DuckDB>_>
                                 ._M_t.
                                 super___uniq_ptr_impl<duckdb::DuckDB,_std::default_delete<duckdb::DuckDB>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_duckdb::DuckDB_*,_std::default_delete<duckdb::DuckDB>_>
                         + 1);
      if (*local_48 == '-') {
        local_48 = (char *)((long)&((&in_RSI->db)[(long)local_40]->db).
                                   super_unique_ptr<duckdb::DuckDB,_std::default_delete<duckdb::DuckDB>_>
                                   ._M_t.
                                   super___uniq_ptr_impl<duckdb::DuckDB,_std::default_delete<duckdb::DuckDB>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_duckdb::DuckDB_*,_std::default_delete<duckdb::DuckDB>_>
                           + 2);
      }
      iVar3 = strcmp(local_48,"newlines");
      if (iVar3 != 0) {
        fprintf(_stderr,"Unknown option \"%s\" on \".dump\"\n",(&in_RSI->db)[(long)local_40]);
        duckdb_shell_sqlite3_free((void *)0x1dd2ec);
        return FAIL;
      }
      duckdb_shell::ShellState::ShellSetFlag(in_RDI,0x10);
    }
    else if (pcVar4 == (char *)0x0) {
      pcVar4 = duckdb_shell_sqlite3_mprintf
                         ("name LIKE %Q ESCAPE \'\\\'",(&in_RSI->db)[(long)local_40]);
    }
    else {
      pcVar4 = duckdb_shell_sqlite3_mprintf
                         ("%z OR name LIKE %Q ESCAPE \'\\\'",pcVar4,(&in_RSI->db)[(long)local_40]);
    }
    local_40 = (ShellState *)((long)&local_40->db + 1);
  } while( true );
}

Assistant:

MetadataResult DumpTable(ShellState &state, const char **azArg, idx_t nArg) {
	char *zLike = 0;
	char *zSql;
	bool savedShowHeader = state.showHeader;
	int savedShellFlags = state.shellFlgs;
	state.ShellClearFlag(SHFLG_PreserveRowid | SHFLG_Newlines | SHFLG_Echo);
	for (idx_t i = 1; i < nArg; i++) {
		if (azArg[i][0] == '-') {
			const char *z = azArg[i] + 1;
			if (z[0] == '-')
				z++;
			if (strcmp(z, "newlines") == 0) {
				state.ShellSetFlag(SHFLG_Newlines);
			} else {
				raw_printf(stderr, "Unknown option \"%s\" on \".dump\"\n", azArg[i]);
				sqlite3_free(zLike);
				return MetadataResult::FAIL;
			}
		} else if (zLike) {
			zLike = sqlite3_mprintf("%z OR name LIKE %Q ESCAPE '\\'", zLike, azArg[i]);
		} else {
			zLike = sqlite3_mprintf("name LIKE %Q ESCAPE '\\'", azArg[i]);
		}
	}

	state.OpenDB(0);

	/* When playing back a "dump", the content might appear in an order
	** which causes immediate foreign key constraints to be violated.
	** So disable foreign-key constraint enforcement to prevent problems. */
	raw_printf(state.out, "BEGIN TRANSACTION;\n");
	state.showHeader = 0;
	state.nErr = 0;
	if (zLike == 0)
		zLike = sqlite3_mprintf("true");
	zSql = sqlite3_mprintf("SELECT name, type, sql FROM sqlite_schema "
	                       "WHERE (%s) AND type=='table'"
	                       "  AND sql NOT NULL"
	                       " ORDER BY tbl_name='sqlite_sequence'",
	                       zLike);
	state.RunSchemaDumpQuery(zSql);
	sqlite3_free(zSql);
	zSql = sqlite3_mprintf("SELECT sql FROM sqlite_schema "
	                       "WHERE (%s) AND sql NOT NULL"
	                       "  AND type IN ('index','trigger','view')",
	                       zLike);
	state.RunTableDumpQuery(zSql);
	sqlite3_free(zSql);
	sqlite3_free(zLike);
	raw_printf(state.out, state.nErr ? "ROLLBACK; -- due to errors\n" : "COMMIT;\n");
	state.showHeader = savedShowHeader;
	state.shellFlgs = savedShellFlags;
	return MetadataResult::SUCCESS;
}